

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

Vec_Int_t * Wln_NtkRetime(Wln_Ntk_t *pNtk,int fSkipSimple,int fVerbose)

{
  Vec_Int_t *p;
  int *piVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  Wln_Ret_t *p_00;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  int *piVar11;
  size_t __size;
  char *__s;
  int iVar12;
  long lVar13;
  int iVar14;
  Vec_Int_t *p_01;
  bool bVar15;
  bool bVar16;
  int local_88;
  int local_84;
  uint local_68;
  int local_64;
  
  p_00 = Wln_RetAlloc(pNtk);
  p = &p_00->vFront;
  pVVar7 = (Vec_Int_t *)calloc(1,0x10);
  Wln_RetPrint(p_00,fVerbose);
  Wln_RetMarkChanges(p_00,(Vec_Int_t *)0x0);
  iVar5 = Wln_RetPropDelay(p_00);
  p_00->DelayMax = iVar5;
  Wln_RetFindSources(p_00);
  uVar10 = p_00->DelayMax;
  printf("Move %4d : Recording initial state     (delay = %6d)\n",0,(ulong)uVar10);
  p_01 = &p_00->vMoves;
  Vec_IntPush(p_01,uVar10);
  Vec_IntPush(p_01,0);
  bVar3 = 0;
  bVar4 = 0;
  iVar14 = 0;
  local_68 = 0;
  uVar10 = 0;
  local_84 = iVar5;
  do {
    if ((p_00->vSources).nSize == 0) {
      if ((p_00->vSinks).nSize == 0) goto LAB_003668c0;
      local_64 = p_00->DelayMax;
      bVar15 = false;
LAB_003664ac:
      iVar6 = Wln_RetCheckBackward(p_00,&p_00->vSinks);
      bVar16 = iVar6 != 0;
    }
    else {
      local_64 = p_00->DelayMax;
      iVar6 = Wln_RetCheckForward(p_00,&p_00->vSources);
      bVar15 = iVar6 != 0;
      if ((p_00->vSinks).nSize != 0) goto LAB_003664ac;
      bVar16 = false;
    }
    qsort((p_00->vSources).pArray,(long)(p_00->vSources).nSize,4,Vec_IntSortCompare1);
    qsort((p_00->vSinks).pArray,(long)(p_00->vSinks).nSize,4,Vec_IntSortCompare1);
    if (!bVar15 && !bVar16) {
      __s = "Cannot retime forward and backward.";
LAB_00366896:
      puts(__s);
LAB_003668c0:
      iVar14 = p_01->nSize;
      piVar8 = (p_00->vMoves).pArray;
      pVVar7->nCap = p_01->nCap;
      pVVar7->nSize = iVar14;
      pVVar7->pArray = piVar8;
      p_01->nCap = 0;
      p_01->nSize = 0;
      (p_00->vMoves).pArray = (int *)0x0;
      Wln_RetFree(p_00);
      if (fVerbose == 0) {
        printf("Retiming instruction contains %d moves and %d total retimed objects.\n",
               (ulong)uVar10,(ulong)((pVVar7->nSize + uVar10 * -2) - 2));
        printf("Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n",
               SUB84(((double)(iVar5 - local_84) * 100.0) / (double)iVar5,0));
      }
      else {
        puts("\nThe resulting moves recorded in terms of name IDs of the NDR nodes:");
        uVar10 = pVVar7->nSize;
        printf("Vector has %d entries: {",(ulong)uVar10);
        if (0 < (long)(int)uVar10) {
          piVar8 = pVVar7->pArray;
          lVar13 = 0;
          do {
            printf(" %d",(ulong)(uint)piVar8[lVar13]);
            lVar13 = lVar13 + 1;
          } while ((int)uVar10 != lVar13);
        }
        puts(" }");
      }
      return pVVar7;
    }
    iVar6 = (p_00->vSources).nSize;
    iVar2 = (p_00->vSinks).nSize;
    if (0 < iVar2 && 0 < (long)iVar6) {
      piVar9 = (p_00->vSources).pArray;
      piVar11 = (p_00->vSinks).pArray;
      piVar8 = piVar9 + iVar6;
      piVar1 = piVar11 + iVar2;
      iVar12 = 0;
      do {
        if (*piVar9 == *piVar11) {
          piVar9 = piVar9 + 1;
          piVar11 = piVar11 + 1;
          iVar12 = iVar12 + 1;
        }
        else if (*piVar9 < *piVar11) {
          piVar9 = piVar9 + 1;
        }
        else {
          piVar11 = piVar11 + 1;
        }
      } while ((piVar9 < piVar8) && (piVar11 < piVar1));
      if (iVar12 != 0) {
        __s = "Cannot reduce delay by retiming.";
        goto LAB_00366896;
      }
    }
    (p_00->vFront).nSize = 0;
    if (((bool)(bVar3 & bVar15)) ||
       ((!(bool)(bVar4 & bVar16) &&
        ((!(bool)(~bVar15 | bVar16) || ((bool)(iVar6 < iVar2 & bVar15 & bVar16))))))) {
      if (0 < iVar6) {
        lVar13 = 0;
        do {
          Vec_IntPush(p,(p_00->vSources).pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (p_00->vSources).nSize);
        if (0 < (p_00->vFront).nSize) {
          lVar13 = 0;
          do {
            Wln_RetMarkChanges_rec(p_00,(p_00->vFront).pArray[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (p_00->vFront).nSize);
        }
      }
      Wln_RetRetimeForward(p_00,p);
      bVar3 = 1;
      local_88 = 1;
    }
    else {
      if (0 < iVar2) {
        lVar13 = 0;
        do {
          Vec_IntPush(p,(p_00->vSinks).pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (p_00->vSinks).nSize);
      }
      Wln_RetRetimeBackward(p_00,p);
      local_88 = 0;
      bVar4 = 1;
      if (0 < (p_00->vFront).nSize) {
        lVar13 = 0;
        do {
          Wln_RetMarkChanges_rec(p_00,(p_00->vFront).pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (p_00->vFront).nSize);
      }
    }
    uVar10 = uVar10 + 1;
    iVar6 = Wln_RetPropDelay(p_00);
    if (iVar6 <= local_84) {
      local_84 = iVar6;
    }
    p_00->DelayMax = iVar6;
    if (fVerbose == 0) {
      Wln_RetAddToMoves(p_00,p,iVar6,local_88,uVar10,fSkipSimple,0);
    }
    else {
      putchar(10);
      Wln_RetAddToMoves(p_00,p,p_00->DelayMax,local_88,uVar10,fSkipSimple,fVerbose);
      printf("Sinks: ");
      printf("Vector has %d entries: {",(ulong)(uint)(p_00->vSinks).nSize);
      if (0 < (p_00->vSinks).nSize) {
        lVar13 = 0;
        do {
          printf(" %d",(ulong)(uint)(p_00->vSinks).pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (p_00->vSinks).nSize);
      }
      puts(" }");
      printf("Sources: ");
      printf("Vector has %d entries: {",(ulong)(uint)(p_00->vSources).nSize);
      if (0 < (p_00->vSources).nSize) {
        lVar13 = 0;
        do {
          printf(" %d",(ulong)(uint)(p_00->vSources).pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (p_00->vSources).nSize);
      }
      puts(" }");
    }
    bVar15 = 0 < iVar14;
    iVar14 = iVar14 + 1;
    if (p_00->DelayMax < local_64) {
      iVar14 = 0;
    }
    if ((3 < iVar14) || (local_68 = local_68 + (bVar15 && p_00->DelayMax < local_64), 5 < local_68))
    goto LAB_003668c0;
    Wln_RetFindSources(p_00);
    iVar6 = (p_00->vEdgeLinks).nSize;
    iVar2 = (p_00->vEdgeLinks).nCap;
    if ((iVar2 < iVar6 * 2) && (iVar12 = (int)((long)iVar6 << 2), iVar2 < iVar12)) {
      piVar8 = (p_00->vEdgeLinks).pArray;
      __size = (long)iVar6 << 4;
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc(__size);
      }
      else {
        piVar8 = (int *)realloc(piVar8,__size);
      }
      (p_00->vEdgeLinks).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p_00->vEdgeLinks).nCap = iVar12;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Wln_NtkRetime( Wln_Ntk_t * pNtk, int fSkipSimple, int fVerbose )
{
    Wln_Ret_t * p = Wln_RetAlloc( pNtk );
    Vec_Int_t * vSources = &p->vSources;
    Vec_Int_t * vSinks   = &p->vSinks;
    Vec_Int_t * vFront   = &p->vFront;
    Vec_Int_t * vMoves   = Vec_IntAlloc(0);
    int nMoves = 0, fPrevFwd = 0, fPrevBwd = 0, nCountIncrease = 0;
    int DelayInit = 0, DelayBest = 0, nChange = 0;
    Wln_RetPrint( p, fVerbose );
    Wln_RetMarkChanges( p, NULL );
    p->DelayMax = DelayInit = DelayBest = Wln_RetPropDelay( p );
    Wln_RetFindSources( p );
    Wln_RetAddToMoves( p, NULL, p->DelayMax, 0, nMoves, fSkipSimple, fVerbose );
    while ( Vec_IntSize(vSources) || Vec_IntSize(vSinks) )
    {
        int DelayMaxPrev = p->DelayMax;
        int fForward  = Vec_IntSize(vSources) && Wln_RetCheckForward( p, vSources );
        int fBackward = Vec_IntSize(vSinks)   && Wln_RetCheckBackward( p, vSinks );
        Vec_IntSort( vSources, 0 );
        Vec_IntSort( vSinks, 0 );

        if ( !fForward && !fBackward )
        {
            printf( "Cannot retime forward and backward.\n" );
            break;
        }
        if ( Vec_IntTwoCountCommon(vSources, vSinks) )
        {
            printf( "Cannot reduce delay by retiming.\n" );
            break;
        }
        nMoves++;
        Vec_IntClear( vFront );
        if ( (fPrevFwd && fForward) || (!(fPrevBwd && fBackward) && ((fForward && !fBackward) || (fForward && fBackward && Vec_IntSize(vSources) < Vec_IntSize(vSinks)))) )
        {
            Vec_IntAppend( vFront, vSources );
            Wln_RetMarkChanges( p, vFront );
            Wln_RetRetimeForward( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 1, fBackward = 0;
            fPrevFwd = 1;
        }
        else
        {
            Vec_IntAppend( vFront, vSinks );
            Wln_RetRetimeBackward( p, vFront );
            Wln_RetMarkChanges( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 0, fBackward = 1;
            fPrevBwd = 1;
        }
        DelayBest = Abc_MinInt( DelayBest, p->DelayMax );
        //Wln_RetPrint( p );
        if ( fVerbose )
            printf( "\n" );
        Wln_RetAddToMoves( p, vFront, p->DelayMax, fForward, nMoves, fSkipSimple, fVerbose );
        if ( fVerbose )
        {
            printf( "Sinks: " );
            Vec_IntPrint( &p->vSinks );
            printf( "Sources: " );
            Vec_IntPrint( &p->vSources );
        }
        if ( p->DelayMax >= DelayMaxPrev )
            nCountIncrease++;
        else
        {
            if ( nCountIncrease > 0 )
                nChange++;
            nCountIncrease = 0;
        }
        if ( nCountIncrease > 3 )
            break;
        if ( nChange > 5 )
            break;
        Wln_RetFindSources( p );
        if ( 2*Vec_IntSize(&p->vEdgeLinks) > Vec_IntCap(&p->vEdgeLinks) )
            Vec_IntGrow( &p->vEdgeLinks, 4*Vec_IntSize(&p->vEdgeLinks) );
    }
    ABC_SWAP( Vec_Int_t, *vMoves, p->vMoves );
    Wln_RetFree( p );
    if ( fVerbose )
    {
        printf( "\nThe resulting moves recorded in terms of name IDs of the NDR nodes:\n" );
        Vec_IntPrint( vMoves );
    }
    else
    {
        printf( "Retiming instruction contains %d moves and %d total retimed objects.\n", nMoves, Vec_IntSize(vMoves)-2*nMoves-2 );
        printf( "Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n", 
            DelayInit, DelayBest, DelayInit - DelayBest, 100.0 * (DelayInit - DelayBest) / DelayInit );
    }
    return vMoves;
}